

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

void __thiscall ThreadPool::clear(ThreadPool *this)

{
  iterator iVar1;
  iterator iVar2;
  list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_> *in_RDI;
  mutex *in_stack_ffffffffffffffe0;
  
  std::mutex::lock(in_stack_ffffffffffffffe0);
  iVar1 = std::__cxx11::list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>::begin
                    (in_RDI);
  iVar2 = std::__cxx11::list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>::end
                    (in_RDI);
  std::for_each<std::_List_iterator<AbstractTaskProvider*>,ThreadPool::clear()::__0>
            (iVar1._M_node,iVar2._M_node);
  std::__cxx11::list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>::clear
            ((list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_> *)
             in_stack_ffffffffffffffe0);
  std::mutex::unlock((mutex *)0x13c0d7);
  return;
}

Assistant:

void ThreadPool::clear()
{
    _taskInfo.lock();
    // complete all tasks without real computations. It helps to avoid a deadlock in a case when thread pool is destroyed
    std::for_each( _task.begin(), _task.end(), []( AbstractTaskProvider * task ) { task->_task( true ); } );
    _task.clear();

    _taskInfo.unlock();
}